

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkhash.c
# Opt level: O2

lh_entry * lh_table_lookup_entry_w_hash(lh_table *t,void *k,unsigned_long h)

{
  void *pvVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  
  uVar3 = (ulong)t->size;
  uVar4 = h % uVar3;
  iVar5 = 0;
  do {
    if ((int)uVar3 <= iVar5) {
      return (lh_entry *)0x0;
    }
    pvVar1 = t->table[uVar4].k;
    if (pvVar1 != (void *)0xfffffffffffffffe) {
      if (pvVar1 == (void *)0xffffffffffffffff) {
        return (lh_entry *)0x0;
      }
      iVar2 = (*t->equal_fn)(pvVar1,k);
      if (iVar2 != 0) {
        return t->table + uVar4;
      }
      uVar3 = (ulong)(uint)t->size;
    }
    uVar4 = uVar4 + 1;
    if ((int)uVar3 == (int)uVar4) {
      uVar4 = 0;
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

struct lh_entry *lh_table_lookup_entry_w_hash(struct lh_table *t, const void *k,
                                              const unsigned long h)
{
	unsigned long n = h % t->size;
	int count = 0;

	while (count < t->size)
	{
		if (t->table[n].k == LH_EMPTY)
			return NULL;
		if (t->table[n].k != LH_FREED && t->equal_fn(t->table[n].k, k))
			return &t->table[n];
		if ((int)++n == t->size)
			n = 0;
		count++;
	}
	return NULL;
}